

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O1

void harrisCorner(Mat *img,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                 int threshold,bool isANMS)

{
  long lVar1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners_00;
  _InputArray *p_Var2;
  pointer pKVar3;
  int in_R8D;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> cornersANMS;
  Mat localMax;
  Mat cNorm;
  Mat c;
  Mat det;
  Mat det2;
  Mat det1;
  Mat GIy2;
  Mat GIx2;
  Mat GIxIy;
  Mat IxIy;
  Mat Iy2;
  Mat Ix2;
  Mat Iy;
  Mat Ix;
  Mat greyImg;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_878;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *local_858;
  ulong local_850 [4];
  undefined1 local_830 [16];
  Size local_820;
  Mat local_7c0 [96];
  Mat local_760 [144];
  undefined1 local_6d0 [16];
  Size SStack_6c0;
  long *local_688;
  Mat local_660 [96];
  Mat aMStack_600 [144];
  Mat local_570 [64];
  ulong *local_530;
  _OutputArray local_510 [4];
  Mat local_4b0 [96];
  Mat local_450 [96];
  Mat local_3f0 [96];
  Mat local_390 [96];
  undefined4 local_330 [2];
  Mat *local_328;
  undefined8 uStack_320;
  Mat local_2d0 [96];
  Mat local_270 [96];
  Mat local_210 [96];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_830._8_8_ = img;
  local_6d0._8_8_ = local_90;
  cv::cvtColor((cv *)local_830,(_InputArray *)local_6d0,(_OutputArray *)0x6,0,in_R8D);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat(local_150);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_830._8_8_ = local_90;
  local_6d0._8_8_ = local_f0;
  cv::Scharr((_InputArray *)local_830,(_OutputArray *)local_6d0,5,1,0,1.0,0.0,4);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_858 = corners;
  local_830._8_8_ = local_90;
  local_6d0._8_8_ = local_150;
  cv::Scharr((_InputArray *)local_830,(_OutputArray *)local_6d0,5,0,1,1.0,0.0,4);
  cv::Mat::Mat(local_1b0);
  cv::Mat::Mat(local_210);
  cv::Mat::Mat(local_270);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_830._8_8_ = local_f0;
  local_6d0._8_8_ = local_1b0;
  cv::pow((_InputArray *)local_830,2.0,(_OutputArray *)local_6d0);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_830._8_8_ = local_150;
  local_6d0._8_8_ = local_210;
  cv::pow((_InputArray *)local_830,2.0,(_OutputArray *)local_6d0);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x1010000;
  uStack_320 = 0;
  local_330[0] = 0x2010000;
  local_830._8_8_ = local_f0;
  local_6d0._8_8_ = local_150;
  local_328 = local_270;
  cv::multiply((_InputArray *)local_830,(_InputArray *)local_6d0,(_OutputArray *)local_330,1.0,-1);
  cv::Mat::Mat((Mat *)local_330);
  cv::Mat::Mat(local_390);
  cv::Mat::Mat(local_2d0);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_850[3] = 0x900000009;
  local_830._8_8_ = local_1b0;
  local_6d0._8_8_ = (Mat *)local_330;
  cv::GaussianBlur(0,0);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_850[2] = 0x900000009;
  local_830._8_8_ = local_210;
  local_6d0._8_8_ = local_390;
  cv::GaussianBlur(0,0);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_850[1] = 0x900000009;
  local_830._8_8_ = local_270;
  local_6d0._8_8_ = local_2d0;
  cv::GaussianBlur(0,0);
  cv::Mat::Mat(local_4b0);
  cv::Mat::Mat(local_3f0);
  cv::Mat::Mat(local_450);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x1010000;
  local_510[0].super__InputArray.sz.width = 0;
  local_510[0].super__InputArray.sz.height = 0;
  local_510[0].super__InputArray.flags = 0x2010000;
  local_830._8_8_ = (Mat *)local_330;
  local_6d0._8_8_ = local_390;
  local_510[0].super__InputArray.obj = local_3f0;
  cv::multiply((_InputArray *)local_830,(_InputArray *)local_6d0,local_510,1.0,-1);
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x2010000;
  local_830._8_8_ = local_2d0;
  local_6d0._8_8_ = local_450;
  cv::pow((_InputArray *)local_830,2.0,(_OutputArray *)local_6d0);
  cv::operator-((Mat *)local_830,local_3f0);
  (**(code **)(*(long *)CONCAT44(local_830._4_4_,local_830._0_4_) + 0x18))
            ((long *)CONCAT44(local_830._4_4_,local_830._0_4_),local_830,local_4b0,0xffffffff);
  cv::Mat::~Mat(local_760);
  cv::Mat::~Mat(local_7c0);
  cv::Mat::~Mat((Mat *)(local_830 + 0x10));
  cv::Mat::Mat((Mat *)local_510);
  cv::Mat::Mat(local_570);
  cv::operator+((Mat *)local_6d0,(Mat *)local_330);
  cv::operator/((Mat *)local_830,(MatExpr *)local_4b0);
  (**(code **)(*(long *)CONCAT44(local_830._4_4_,local_830._0_4_) + 0x18))
            ((long *)CONCAT44(local_830._4_4_,local_830._0_4_),local_830,local_510,0xffffffff);
  cv::Mat::~Mat(local_760);
  cv::Mat::~Mat(local_7c0);
  cv::Mat::~Mat((Mat *)(local_830 + 0x10));
  cv::Mat::~Mat(aMStack_600);
  cv::Mat::~Mat(local_660);
  cv::Mat::~Mat((Mat *)(local_6d0 + 0x10));
  local_820.width = 0;
  local_820.height = 0;
  local_830._0_4_ = 0x1010000;
  SStack_6c0.width = 0;
  SStack_6c0.height = 0;
  local_6d0._0_4_ = 0x3010000;
  local_830._8_8_ = local_510;
  local_6d0._8_8_ = local_570;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::normalize((_InputArray *)local_830,(_InputOutputArray *)local_6d0,0.0,255.0,0x20,5,p_Var2);
  corners_00 = local_858;
  if (isANMS) {
    local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ANMS(local_570,&local_878,threshold);
    local_850[0] = *local_530 << 0x20 | *local_530 >> 0x20;
    cv::Mat::zeros(local_830,local_850,5);
    cv::Mat::Mat((Mat *)local_6d0);
    (**(code **)(*(long *)CONCAT44(local_830._4_4_,local_830._0_4_) + 0x18))
              ((long *)CONCAT44(local_830._4_4_,local_830._0_4_),local_830,(Mat *)local_6d0,
               0xffffffff);
    cv::Mat::~Mat(local_760);
    cv::Mat::~Mat(local_7c0);
    cv::Mat::~Mat((Mat *)(local_830 + 0x10));
    if (local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar1 = *local_688;
      pKVar3 = local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        *(float *)((int)ROUND((pKVar3->pt).y) * lVar1 + (long)SStack_6c0 +
                  (long)(int)ROUND((pKVar3->pt).x) * 4) = pKVar3->response;
        pKVar3 = pKVar3 + 1;
      } while (pKVar3 != local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    localMaxima((Mat *)local_6d0,corners_00,0);
    cv::Mat::~Mat((Mat *)local_6d0);
    if (local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_878.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_878.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_878.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    localMaxima(local_570,local_858,threshold);
  }
  cv::Mat::~Mat(local_570);
  cv::Mat::~Mat((Mat *)local_510);
  cv::Mat::~Mat(local_450);
  cv::Mat::~Mat(local_3f0);
  cv::Mat::~Mat(local_4b0);
  cv::Mat::~Mat(local_2d0);
  cv::Mat::~Mat(local_390);
  cv::Mat::~Mat((Mat *)local_330);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat(local_1b0);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void harrisCorner(const Mat& img, vector<KeyPoint>& corners, int threshold, bool isANMS) {
	Mat greyImg;
	cvtColor(img, greyImg, COLOR_BGR2GRAY);
	//GaussianBlur(greyImg, greyImg, Size(3, 3),1);
	Mat Ix, Iy;
	Scharr(greyImg, Ix, CV_32F, 1, 0);
	Scharr(greyImg, Iy, CV_32F, 0, 1);
	Mat Ix2, Iy2, IxIy;
	pow(Ix,2.0,Ix2);
	pow(Iy, 2.0, Iy2);
	multiply(Ix, Iy, IxIy);

	Mat GIx2, GIy2, GIxIy;
	GaussianBlur(Ix2, GIx2, Size(9, 9), 1);
	GaussianBlur(Iy2, GIy2, Size(9, 9), 1);
	GaussianBlur(IxIy, GIxIy, Size(9, 9), 1);

	Mat det, det1, det2;
	multiply(GIx2, GIy2, det1);
	pow(GIxIy, 2.0, det2);
	det = det1 - det2;

	Mat c, cNorm;
	c = det/(GIx2+GIy2);

	normalize(c, cNorm, 0, 255, NORM_MINMAX, CV_32F);
	
	if (isANMS) {
		std::vector<KeyPoint> cornersANMS;
		ANMS(cNorm, cornersANMS, threshold);

		Mat localMax = Mat::zeros(cNorm.size(), CV_32F);
		for (KeyPoint point : cornersANMS) {
			localMax.at<float>(point.pt) = point.response;
		}
		localMaxima(localMax, corners, 0);
	}
	else {
		localMaxima(cNorm, corners, threshold);
	}

}